

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O2

BIGNUM * gost_get0_priv_key(EVP_PKEY *pkey)

{
  int iVar1;
  EC_KEY *key;
  BIGNUM *pBVar2;
  
  iVar1 = EVP_PKEY_get_base_id();
  if (((iVar1 - 0x3d3U < 2) || (iVar1 == 0x331)) || (iVar1 == 0x32b)) {
    key = (EC_KEY *)EVP_PKEY_get0((EVP_PKEY *)pkey);
    if (key != (EC_KEY *)0x0) {
      pBVar2 = EC_KEY_get0_private_key(key);
      return (BIGNUM *)pBVar2;
    }
  }
  return (BIGNUM *)0x0;
}

Assistant:

BIGNUM *gost_get0_priv_key(const EVP_PKEY *pkey)
{
    switch (EVP_PKEY_base_id(pkey)) {
    case NID_id_GostR3410_2012_512:
    case NID_id_GostR3410_2012_256:
    case NID_id_GostR3410_2001:
    case NID_id_GostR3410_2001DH:
        {
            EC_KEY *ec = EVP_PKEY_get0((EVP_PKEY *)pkey);
            if (ec)
                return (BIGNUM *)EC_KEY_get0_private_key(ec);
            break;
        }
    }
    return NULL;
}